

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

uint __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::
consume_one<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>,mvm::consumers<>,mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::list::mplist<unsigned_int>>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this)

{
  uint uVar1;
  uint local_14;
  interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
  *local_10;
  interpreter<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
  *this_local;
  
  local_10 = this;
  local_14 = consume_bytecode<mvm::bytecode_serializer,unsigned_int>(this);
  uVar1 = consume_one<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>,mvm::consumers<>,mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::list::mplist<>,unsigned_int>
                    (this,&local_14);
  return uVar1;
}

Assistant:

auto consume_one(Args &&... args) {
    using instance_type = instance_of_tie_t<instance_list_type, Consumer>;

    if constexpr (list::is_empty_v<DataList>) {
      // all data has been consumed
      // call consume all back
      return this->consume_all<I, Consumers>(std::forward<Args>(args)...);
    } else if constexpr (concept ::is_meta_bytecode_v<
                             Consumer::template meta_type>) {
      // bytecode parsing specific case
      return consume_one<I, Consumers, Consumer, list::pop_front_t<DataList>>(
          this->consume_bytecode<instance_type, list::front_t<DataList>>(),
          std::forward<Args>(args)...);
    } else if constexpr (concept ::is_iterable_consumer_v<Consumer>) {
      using counter_type = typename Consumer::counter_type;
      auto code = this->consume_bytecode<
          instance_of_tie_t<instance_list_type,
                            typename counter_type::meta_type>,
          typename counter_type::type>();

      using current_data_type = std::decay_t<list::front_t<DataList>>;

      current_data_type iter;
      for (std::size_t i = 0; i < code; ++i) {
        iter.push_back(
            std::get<instance_type>(m_instances)
                .template pop<typename current_data_type::value_type>());
      }

      return consume_one<I, Consumers, Consumer, list::pop_front_t<DataList>>(
          std::move(iter), std::forward<Args>(args)...);

    } else {
      return consume_one<I, Consumers, Consumer, list::pop_front_t<DataList>>(
          std::get<instance_type>(m_instances)
              .template pop<list::front_t<DataList>>(),
          std::forward<Args>(args)...);
    }
  }